

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O0

QRect __thiscall
QGraphicsItemEffectSourcePrivate::deviceRect(QGraphicsItemEffectSourcePrivate *this)

{
  long lVar1;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  QWidget *in_stack_ffffffffffffffc8;
  QRect local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[4].context.category == (char *)0x0) ||
     (*(long *)(in_RDI[4].context.category + 0x20) == 0)) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_RDI,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (&stack0xffffffffffffffc8,
               "QGraphicsEffectSource::deviceRect: Not yet implemented, lacking device context");
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  else {
    local_18 = QWidget::rect(in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QRect deviceRect() const override
    {
        if (!info || !info->widget) {
            qWarning("QGraphicsEffectSource::deviceRect: Not yet implemented, lacking device context");
            return QRect();
        }
        return info->widget->rect();
    }